

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ModelDescription::ModelDescription
          (ModelDescription *this,ModelDescription *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  string *psVar2;
  long lVar3;
  Metadata *this_01;
  ModelDescription *from_local;
  ModelDescription *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelDescription_00625390;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->input_,&from->input_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->output_,&from->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->traininginput_,&from->traininginput_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->predictedfeaturename_,psVar2);
  predictedfeaturename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->predictedfeaturename_,psVar2,(from->predictedfeaturename_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->predictedprobabilitiesname_,psVar2);
  predictedprobabilitiesname_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->predictedprobabilitiesname_,psVar2,(from->predictedprobabilitiesname_).ptr_);
  }
  bVar1 = has_metadata(from);
  if (bVar1) {
    this_01 = (Metadata *)operator_new(0x58);
    Metadata::Metadata(this_01,from->metadata_);
    this->metadata_ = this_01;
  }
  else {
    this->metadata_ = (Metadata *)0x0;
  }
  return;
}

Assistant:

ModelDescription::ModelDescription(const ModelDescription& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      input_(from.input_),
      output_(from.output_),
      traininginput_(from.traininginput_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  predictedfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.predictedfeaturename().size() > 0) {
    predictedfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedfeaturename_);
  }
  predictedprobabilitiesname_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.predictedprobabilitiesname().size() > 0) {
    predictedprobabilitiesname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedprobabilitiesname_);
  }
  if (from.has_metadata()) {
    metadata_ = new ::CoreML::Specification::Metadata(*from.metadata_);
  } else {
    metadata_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ModelDescription)
}